

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFCommentWriter.cpp
# Opt level: O3

EStatusCodeAndObjectIDType __thiscall
PDFCommentWriter::WriteCommentsTree
          (PDFCommentWriter *this,PDFComment *inComment,
          PDFCommentToObjectIDTypeMap *inCommentsContext)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  EStatusCode EVar3;
  _Base_ptr p_Var4;
  undefined8 uVar5;
  ObjectsContext *this_00;
  _Base_ptr p_Var6;
  DictionaryContext *this_01;
  string *psVar7;
  long lVar8;
  Trace *this_02;
  long lVar10;
  long lVar11;
  char *inFormat;
  EStatusCodeAndObjectIDType EVar12;
  undefined1 local_68 [32];
  _Rb_tree<PDFComment*,std::pair<PDFComment*const,unsigned_long>,std::_Select1st<std::pair<PDFComment*const,unsigned_long>>,std::less<PDFComment*>,std::allocator<std::pair<PDFComment*const,unsigned_long>>>
  *local_48;
  pointer local_40;
  _Base_ptr local_38;
  pointer pcVar9;
  
  p_Var6 = (inCommentsContext->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 == (_Base_ptr)0x0) {
LAB_0019356a:
    if (inComment->ReplyTo == (PDFComment *)0x0) {
      pcVar9 = (pointer)0x0;
    }
    else {
      EVar12 = WriteCommentsTree(this,inComment->ReplyTo,inCommentsContext);
      pcVar9 = (pointer)EVar12.second;
      if (EVar12.first != eSuccess) {
        uVar5 = 0xffffffff;
        p_Var6 = (_Base_ptr)0x0;
        goto LAB_00193b53;
      }
    }
    this_00 = PDFWriter::GetObjectsContext(this->mPDFWriter);
    p_Var6 = (_Base_ptr)ObjectsContext::StartNewIndirectObject(this_00);
    if (p_Var6 == (_Base_ptr)0x0) {
      this_02 = Trace::DefaultTrace();
      inFormat = "PDFCommentWriter::WriteCommentsTree, Exception in starting comment dictionary";
      p_Var6 = (_Base_ptr)0x0;
    }
    else {
      local_48 = (_Rb_tree<PDFComment*,std::pair<PDFComment*const,unsigned_long>,std::_Select1st<std::pair<PDFComment*const,unsigned_long>>,std::less<PDFComment*>,std::allocator<std::pair<PDFComment*const,unsigned_long>>>
                  *)inCommentsContext;
      local_38 = p_Var6;
      this_01 = ObjectsContext::StartDictionary(this_00);
      pcVar2 = local_68 + 0x10;
      local_68._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Type","");
      DictionaryContext::WriteKey(this_01,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar2) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      local_68._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Annot","");
      DictionaryContext::WriteNameValue(this_01,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar2) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      local_68._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Subtype","");
      DictionaryContext::WriteKey(this_01,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar2) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      local_68._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Text","");
      DictionaryContext::WriteNameValue(this_01,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar2) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      local_68._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Rect","");
      DictionaryContext::WriteKey(this_01,(string *)local_68);
      local_40 = pcVar9;
      if ((pointer)local_68._0_8_ != pcVar2) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      PDFRectangle::PDFRectangle
                ((PDFRectangle *)local_68,inComment->FrameBoundings[0],inComment->FrameBoundings[1],
                 inComment->FrameBoundings[2],inComment->FrameBoundings[3]);
      DictionaryContext::WriteRectangleValue(this_01,(PDFRectangle *)local_68);
      PDFRectangle::~PDFRectangle((PDFRectangle *)local_68);
      local_68._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Contents","");
      DictionaryContext::WriteKey(this_01,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar2) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      PDFTextString::PDFTextString((PDFTextString *)local_68,&inComment->Text);
      psVar7 = PDFTextString::ToString_abi_cxx11_((PDFTextString *)local_68);
      DictionaryContext::WriteLiteralStringValue(this_01,psVar7);
      PDFTextString::~PDFTextString((PDFTextString *)local_68);
      local_68._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"C","");
      DictionaryContext::WriteKey(this_01,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar2) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      ObjectsContext::StartArray(this_00);
      if ((inComment->Color).UseCMYK == true) {
        ObjectsContext::WriteDouble
                  (this_00,(double)(inComment->Color).CMYKComponents[0] / 255.0,eTokenSeparatorSpace
                  );
        lVar11 = 0x67;
        lVar10 = 0x66;
        lVar8 = 0x65;
      }
      else {
        lVar11 = 99;
        lVar10 = 0x62;
        lVar8 = 0x61;
      }
      ObjectsContext::WriteDouble
                (this_00,(double)*(byte *)((long)inComment->FrameBoundings + lVar8 + -0x40) / 255.0,
                 eTokenSeparatorSpace);
      ObjectsContext::WriteDouble
                (this_00,(double)*(byte *)((long)inComment->FrameBoundings + lVar10 + -0x40) / 255.0
                 ,eTokenSeparatorSpace);
      ObjectsContext::WriteDouble
                (this_00,(double)*(byte *)((long)inComment->FrameBoundings + lVar11 + -0x40) / 255.0
                 ,eTokenSeparatorSpace);
      ObjectsContext::EndArray(this_00,eTokenSeparatorEndLine);
      local_68._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"T","");
      DictionaryContext::WriteKey(this_01,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar2) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      PDFTextString::PDFTextString((PDFTextString *)local_68,&inComment->CommentatorName);
      psVar7 = PDFTextString::ToString_abi_cxx11_((PDFTextString *)local_68);
      DictionaryContext::WriteLiteralStringValue(this_01,psVar7);
      PDFTextString::~PDFTextString((PDFTextString *)local_68);
      local_68._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"M","");
      DictionaryContext::WriteKey(this_01,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar2) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      PDFDate::ToString_abi_cxx11_((string *)local_68,&inComment->Time);
      DictionaryContext::WriteLiteralStringValue(this_01,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar2) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      if (inComment->ReplyTo != (PDFComment *)0x0) {
        local_68._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"IRT","");
        DictionaryContext::WriteKey(this_01,(string *)local_68);
        if ((pointer)local_68._0_8_ != pcVar2) {
          operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        }
        local_68._0_8_ = local_40;
        local_68._8_8_ = 0.0;
        DictionaryContext::WriteObjectReferenceValue(this_01,(ObjectReference *)local_68);
        local_68._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"RT","");
        DictionaryContext::WriteKey(this_01,(string *)local_68);
        if ((pointer)local_68._0_8_ != pcVar2) {
          operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        }
        local_68._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"R","");
        DictionaryContext::WriteNameValue(this_01,(string *)local_68);
        if ((pointer)local_68._0_8_ != pcVar2) {
          operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        }
      }
      local_68._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Open","");
      DictionaryContext::WriteKey(this_01,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar2) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      DictionaryContext::WriteBooleanValue(this_01,false);
      local_68._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Name","");
      DictionaryContext::WriteKey(this_01,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar2) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      local_68._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Comment","");
      DictionaryContext::WriteNameValue(this_01,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar2) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      EVar3 = ObjectsContext::EndDictionary(this_00,this_01);
      p_Var6 = local_38;
      if (EVar3 == eSuccess) {
        ObjectsContext::EndIndirectObject(this_00);
        local_68._8_8_ = p_Var6;
        local_68._0_8_ = inComment;
        std::
        _Rb_tree<PDFComment*,std::pair<PDFComment*const,unsigned_long>,std::_Select1st<std::pair<PDFComment*const,unsigned_long>>,std::less<PDFComment*>,std::allocator<std::pair<PDFComment*const,unsigned_long>>>
        ::_M_insert_unique<std::pair<PDFComment*const,unsigned_long>>
                  (local_48,(pair<PDFComment_*const,_unsigned_long> *)local_68);
        goto LAB_00193b51;
      }
      this_02 = Trace::DefaultTrace();
      inFormat = "PDFCommentWriter::WriteCommentsTree, Exception in ending comment dictionary";
    }
    Trace::TraceToLog(this_02,inFormat);
    uVar5 = 0xffffffff;
  }
  else {
    p_Var1 = &(inCommentsContext->_M_t)._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      if (*(PDFComment **)(p_Var6 + 1) >= inComment) {
        p_Var4 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(PDFComment **)(p_Var6 + 1) < inComment];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 == p_Var1) || (inComment < *(PDFComment **)(p_Var4 + 1)))
    goto LAB_0019356a;
    p_Var6 = p_Var4[1]._M_parent;
LAB_00193b51:
    uVar5 = 0;
  }
LAB_00193b53:
  EVar12.second = (unsigned_long)p_Var6;
  EVar12._0_8_ = uVar5;
  return EVar12;
}

Assistant:

EStatusCodeAndObjectIDType PDFCommentWriter::WriteCommentsTree(PDFComment* inComment,PDFCommentToObjectIDTypeMap& inCommentsContext)
{
	EStatusCodeAndObjectIDType result;
	ObjectIDType repliedTo = 0;

	// if already written, return
	PDFCommentToObjectIDTypeMap::iterator it = inCommentsContext.find(inComment);
	if(it != inCommentsContext.end())
	{
		result.first = eSuccess;
		result.second = it->second;
		return result;
	}

	// if has a referred comment, write it first
	if(inComment->ReplyTo != NULL)
	{
		EStatusCodeAndObjectIDType repliedtoResult = WriteCommentsTree(inComment->ReplyTo,inCommentsContext);

		if(repliedtoResult.first != eSuccess)
		{
			result.first = eFailure;
			result.second = 0;
			return result;
		}
		else
			repliedTo = repliedtoResult.second;
	}

	do
	{
		ObjectsContext& objectsContext = mPDFWriter->GetObjectsContext();

		// Start new InDirect object for annotation dictionary
		result.second = objectsContext.StartNewIndirectObject();
		if(result.second == 0)
		{
			result.first = eFailure;
			TRACE_LOG("PDFCommentWriter::WriteCommentsTree, Exception in starting comment dictionary");
			break;
		}
		
		DictionaryContext* dictionaryContext = objectsContext.StartDictionary();


		// Type
		dictionaryContext->WriteKey("Type");
		dictionaryContext->WriteNameValue("Annot");

		// SubType
		dictionaryContext->WriteKey("Subtype");
		dictionaryContext->WriteNameValue("Text");

		// Rect
		dictionaryContext->WriteKey("Rect");
		dictionaryContext->WriteRectangleValue(
			PDFRectangle(inComment->FrameBoundings[0],
						 inComment->FrameBoundings[1],
						 inComment->FrameBoundings[2],
						 inComment->FrameBoundings[3]));

		// Contents 
		dictionaryContext->WriteKey("Contents");
		dictionaryContext->WriteLiteralStringValue(PDFTextString(inComment->Text).ToString());

		// C (color)
		dictionaryContext->WriteKey("C");
		objectsContext.StartArray();
		if(inComment->Color.UseCMYK)
		{
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[0]/255);
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[1]/255);
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[2]/255);
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[3]/255);
		}
		else
		{
			objectsContext.WriteDouble((double)inComment->Color.RGBComponents[0]/255);
			objectsContext.WriteDouble((double)inComment->Color.RGBComponents[1]/255);
			objectsContext.WriteDouble((double)inComment->Color.RGBComponents[2]/255);
		}
		objectsContext.EndArray(eTokenSeparatorEndLine);

		// T
		dictionaryContext->WriteKey("T");
		dictionaryContext->WriteLiteralStringValue(PDFTextString(inComment->CommentatorName).ToString());
		
		// M
		dictionaryContext->WriteKey("M");
		dictionaryContext->WriteLiteralStringValue(inComment->Time.ToString());

		if(inComment->ReplyTo != NULL)
		{
			// IRT
			dictionaryContext->WriteKey("IRT");
			dictionaryContext->WriteObjectReferenceValue(repliedTo);

			// RT (we're doing always "reply" at this point, being a reply to comment
			dictionaryContext->WriteKey("RT");
			dictionaryContext->WriteNameValue("R");
		}

		// Open (we'll have them all closed to begin with)
		dictionaryContext->WriteKey("Open");
		dictionaryContext->WriteBooleanValue(false);

		// Name
		dictionaryContext->WriteKey("Name");
		dictionaryContext->WriteNameValue("Comment");

		if(objectsContext.EndDictionary(dictionaryContext) != eSuccess)
		{
			result.first = eFailure;
			TRACE_LOG("PDFCommentWriter::WriteCommentsTree, Exception in ending comment dictionary");
			break;
		}
		objectsContext.EndIndirectObject();
	
		inCommentsContext.insert(PDFCommentToObjectIDTypeMap::value_type(inComment,result.second));

		result.first = eSuccess;
	}while(false);
	
	return result;
}